

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O1

AudioBackend_Sound * AudioBackend_CreateSound(uint frequency,size_t frames)

{
  AudioBackend_Sound *__ptr;
  uchar *puVar1;
  
  __ptr = (AudioBackend_Sound *)malloc(0x48);
  if (__ptr != (AudioBackend_Sound *)0x0) {
    puVar1 = (uchar *)malloc(frames + 1);
    __ptr->samples = puVar1;
    if (puVar1 != (uchar *)0x0) {
      __ptr->frames = frames;
      __ptr->playing = false;
      __ptr->position = 0.0;
      __ptr->frequency = frequency;
      __ptr->advance_delta = (double)frequency / (double)(long)output_frequency;
      __ptr->volume = 1.0;
      __ptr->pan_l = 1.0;
      __ptr->pan_r = 1.0;
      __ptr->volume_l = 1.0;
      __ptr->volume_r = 1.0;
      if (mutex.pContext != (ma_context *)0x0) {
        (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a818);
      }
      __ptr->next = sound_list_head;
      if (mutex.pContext == (ma_context *)0x0) {
        sound_list_head = __ptr;
        return __ptr;
      }
      sound_list_head = __ptr;
      (*((mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x12a818);
      return __ptr;
    }
    free(__ptr);
  }
  return (AudioBackend_Sound *)0x0;
}

Assistant:

AudioBackend_Sound* AudioBackend_CreateSound(unsigned int frequency, size_t frames)
{
	AudioBackend_Sound *sound = (AudioBackend_Sound*)malloc(sizeof(AudioBackend_Sound));

	if (sound == NULL)
		return NULL;

	sound->samples = (unsigned char*)malloc(frames + 1);

	if (sound->samples == NULL)
	{
		free(sound);
		return NULL;
	}

	sound->frames = frames;
	sound->playing = FALSE;
	sound->position = 0.0;

	SetSoundFrequency(sound, frequency);
	SetSoundVolume(sound, 0);
	SetSoundPan(sound, 0);

	ma_mutex_lock(&mutex);

	sound->next = sound_list_head;
	sound_list_head = sound;

	ma_mutex_unlock(&mutex);

	return sound;
}